

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall sglr::ReferenceContext::deleteBuffer(ReferenceContext *this,DataBuffer *buffer)

{
  ObjectManager<sglr::rc::DataBuffer> *this_00;
  deUint32 target;
  DataBuffer *pDVar1;
  pointer pVVar2;
  pointer ppVVar3;
  long lVar4;
  ulong uVar5;
  vector<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_> vertexArrays;
  vector<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_> local_58;
  ReferenceContext *local_40;
  VertexArray *local_38;
  
  lVar4 = 0;
  do {
    target = *(deUint32 *)((long)deleteBuffer::bindingPoints + lVar4);
    pDVar1 = getBufferBinding(this,target);
    if (pDVar1 == buffer) {
      setBufferBinding(this,target,(DataBuffer *)0x0);
    }
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x24);
  local_58.super__Vector_base<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  rc::ObjectManager<sglr::rc::VertexArray>::getAll(&this->m_vertexArrays,&local_58);
  local_38 = &this->m_clientVertexArray;
  local_40 = this;
  std::vector<sglr::rc::VertexArray*,std::allocator<sglr::rc::VertexArray*>>::
  emplace_back<sglr::rc::VertexArray*>
            ((vector<sglr::rc::VertexArray*,std::allocator<sglr::rc::VertexArray*>> *)&local_58,
             &local_38);
  if (local_58.super__Vector_base<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_58.super__Vector_base<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this_00 = &local_40->m_buffers;
    ppVVar3 = local_58.
              super__Vector_base<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      if ((*ppVVar3)->m_elementArrayBufferBinding == buffer) {
        rc::ObjectManager<sglr::rc::DataBuffer>::releaseReference(this_00,buffer);
        (*ppVVar3)->m_elementArrayBufferBinding = (DataBuffer *)0x0;
      }
      pVVar2 = ((*ppVVar3)->m_arrays).
               super__Vector_base<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (((*ppVVar3)->m_arrays).
          super__Vector_base<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
          ._M_impl.super__Vector_impl_data._M_finish != pVVar2) {
        lVar4 = 0x20;
        uVar5 = 0;
        do {
          if (*(DataBuffer **)(&pVVar2->enabled + lVar4) == buffer) {
            rc::ObjectManager<sglr::rc::DataBuffer>::releaseReference(this_00,buffer);
            pVVar2 = ((*ppVVar3)->m_arrays).
                     super__Vector_base<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            *(undefined1 *)((long)pVVar2 + lVar4 + -8) = 1;
            *(undefined8 *)(&pVVar2->enabled + lVar4) = 0;
          }
          uVar5 = uVar5 + 1;
          pVVar2 = ((*ppVVar3)->m_arrays).
                   super__Vector_base<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar4 = lVar4 + 0x30;
        } while (uVar5 < (ulong)(((long)((*ppVVar3)->m_arrays).
                                        super__Vector_base<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2 >>
                                 4) * -0x5555555555555555));
      }
      ppVVar3 = ppVVar3 + 1;
    } while (ppVVar3 !=
             local_58.
             super__Vector_base<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_58.super__Vector_base<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  rc::ObjectManager<sglr::rc::DataBuffer>::releaseReference(&local_40->m_buffers,buffer);
  return;
}

Assistant:

void ReferenceContext::deleteBuffer (DataBuffer* buffer)
{
	static const deUint32 bindingPoints[] =
	{
		GL_ARRAY_BUFFER,
		GL_COPY_READ_BUFFER,
		GL_COPY_WRITE_BUFFER,
		GL_DRAW_INDIRECT_BUFFER,
		GL_ELEMENT_ARRAY_BUFFER,
		GL_PIXEL_PACK_BUFFER,
		GL_PIXEL_UNPACK_BUFFER,
		GL_TRANSFORM_FEEDBACK_BUFFER,
		GL_UNIFORM_BUFFER
	};

	for (int bindingNdx = 0; bindingNdx < DE_LENGTH_OF_ARRAY(bindingPoints); bindingNdx++)
	{
		if (getBufferBinding(bindingPoints[bindingNdx]) == buffer)
			setBufferBinding(bindingPoints[bindingNdx], DE_NULL);
	}

	{
		vector<VertexArray*> vertexArrays;
		m_vertexArrays.getAll(vertexArrays);
		vertexArrays.push_back(&m_clientVertexArray);

		for (vector<VertexArray*>::iterator i = vertexArrays.begin(); i != vertexArrays.end(); i++)
		{
			if ((*i)->m_elementArrayBufferBinding == buffer)
			{
				m_buffers.releaseReference(buffer);
				(*i)->m_elementArrayBufferBinding = DE_NULL;
			}

			for (size_t vertexAttribNdx = 0; vertexAttribNdx < (*i)->m_arrays.size(); ++vertexAttribNdx)
			{
				if ((*i)->m_arrays[vertexAttribNdx].bufferBinding == buffer)
				{
					m_buffers.releaseReference(buffer);
					(*i)->m_arrays[vertexAttribNdx].bufferDeleted = true;
					(*i)->m_arrays[vertexAttribNdx].bufferBinding = DE_NULL;
				}
			}
		}
	}

	DE_ASSERT(buffer->getRefCount() == 1);
	m_buffers.releaseReference(buffer);
}